

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::anon_unknown_1::hexEscapeChar(ostream *os,uchar c)

{
  ostream *poVar1;
  undefined4 uVar2;
  long lVar3;
  ostream oVar4;
  
  uVar2 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,"\\x",2);
  lVar3 = *(long *)os;
  *(uint *)(os + *(long *)(lVar3 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar3 + -0x18) + 0x18) | 0x4000;
  *(uint *)(os + *(long *)(lVar3 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = os + *(long *)(lVar3 + -0x18);
  if (os[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
  }
  poVar1[0xe0] = (ostream)0x30;
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
  std::ostream::operator<<(os,(uint)c);
  *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar2;
  return;
}

Assistant:

void hexEscapeChar(std::ostream& os, unsigned char c) {
        std::ios_base::fmtflags f(os.flags());
        os << "\\x"
            << std::uppercase << std::hex << std::setfill('0') << std::setw(2)
            << static_cast<int>(c);
        os.flags(f);
    }